

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_package::translate
          (method_package *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  const_reference pptVar2;
  token_base **pptVar3;
  var_id *this_00;
  string *psVar4;
  element_type *peVar5;
  string *in_stack_ffffffffffffff68;
  compile_error *in_stack_ffffffffffffff70;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffff80;
  allocator *paVar6;
  allocator local_59;
  string local_58 [8];
  iterator *in_stack_ffffffffffffffb0;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x561e4c);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    paVar6 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Redefinition of package: ",paVar6);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x561eab);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff70);
    compile_error::compile_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(__lhs,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffff80);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  token_expr::get_tree((token_expr *)*pptVar2);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff68);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffffb0);
  this_00 = token_id::get_id((token_id *)*pptVar3);
  psVar4 = var_id::operator_cast_to_string_(this_00);
  peVar5 = std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x561fb3);
  std::__cxx11::string::operator=((string *)&peVar5->package_name,(string *)psVar4);
  return (statement_base *)0x0;
}

Assistant:

statement_base *
	method_package::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		if (!context->package_name.empty())
			throw compile_error(std::string("Redefinition of package: ") + context->package_name);
		context->package_name = static_cast<token_id *>(static_cast<token_expr *>(raw.front().at(
		                            1))->get_tree().root().data())->get_id();
		return nullptr;
	}